

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-alloc.c
# Opt level: O2

_Bool ggml_gallocr_alloc_graph(ggml_gallocr_t galloc,ggml_cgraph *graph)

{
  ggml_tensor *pgVar1;
  node_alloc *pnVar2;
  ggml_tensor *pgVar3;
  _Bool _Var4;
  int iVar5;
  int i_1;
  long lVar6;
  long lVar7;
  int i;
  long lVar8;
  tensor_alloc *ptVar9;
  int i_2;
  
  iVar5 = galloc->n_nodes;
  if ((iVar5 == graph->n_nodes) && (galloc->n_leafs == graph->n_leafs)) {
    lVar8 = 0x18;
    for (lVar7 = 0; lVar7 < iVar5; lVar7 = lVar7 + 1) {
      pgVar1 = graph->nodes[lVar7];
      pnVar2 = galloc->node_allocs;
      _Var4 = ggml_gallocr_node_needs_realloc(galloc,pgVar1,&pnVar2[lVar7].dst);
      if (!_Var4) goto LAB_00129a02;
      ptVar9 = (tensor_alloc *)((long)&(((node_alloc *)(pnVar2->src + -1))->dst).buffer_id + lVar8);
      for (lVar6 = 0; lVar6 != 10; lVar6 = lVar6 + 1) {
        pgVar3 = pgVar1->src[lVar6];
        if (pgVar3 != (ggml_tensor *)0x0) {
          _Var4 = ggml_gallocr_node_needs_realloc(galloc,pgVar3,ptVar9);
          if (!_Var4) goto LAB_00129a02;
        }
        ptVar9 = ptVar9 + 1;
      }
      iVar5 = graph->n_nodes;
      lVar8 = lVar8 + 0x108;
    }
LAB_00129a1d:
    lVar8 = 0x18;
    for (lVar7 = 0; lVar7 < galloc->n_buffers; lVar7 = lVar7 + 1) {
      if (galloc->buffers[lVar7] != (ggml_backend_buffer_t)0x0) {
        ggml_backend_buffer_reset(galloc->buffers[lVar7]);
      }
    }
    lVar7 = 0;
    for (lVar6 = 0; lVar6 < graph->n_leafs; lVar6 = lVar6 + 1) {
      ggml_gallocr_init_tensor
                (galloc,graph->leafs[lVar6],
                 (tensor_alloc *)((long)&(galloc->leaf_allocs->leaf).buffer_id + lVar7));
      lVar7 = lVar7 + 0x18;
    }
    for (lVar7 = 0; lVar7 < graph->n_nodes; lVar7 = lVar7 + 1) {
      pgVar1 = graph->nodes[lVar7];
      pnVar2 = galloc->node_allocs;
      ptVar9 = (tensor_alloc *)((long)&(((node_alloc *)(pnVar2->src + -1))->dst).buffer_id + lVar8);
      for (lVar6 = 0x13; lVar6 != 0x1d; lVar6 = lVar6 + 1) {
        pgVar3 = (ggml_tensor *)pgVar1->ne[lVar6 + -2];
        if (pgVar3 != (ggml_tensor *)0x0) {
          ggml_gallocr_init_tensor(galloc,pgVar3,ptVar9);
        }
        ptVar9 = ptVar9 + 1;
      }
      ggml_gallocr_init_tensor(galloc,pgVar1,&pnVar2[lVar7].dst);
      lVar8 = lVar8 + 0x108;
    }
    _Var4 = true;
  }
  else {
LAB_00129a02:
    if (galloc->n_buffers == 1) {
      _Var4 = ggml_gallocr_reserve(galloc,graph);
      if (_Var4) goto LAB_00129a1d;
    }
    _Var4 = false;
  }
  return _Var4;
}

Assistant:

bool ggml_gallocr_alloc_graph(ggml_gallocr_t galloc, struct ggml_cgraph * graph) {
    if (ggml_gallocr_needs_realloc(galloc, graph)) {
        if (galloc->n_buffers == 1) {
#ifndef NDEBUG
            GGML_LOG_DEBUG("%s: reallocating buffers automatically\n", __func__);
#endif
            if (!ggml_gallocr_reserve(galloc, graph)) {
                return false;
            }
        } else {
#ifndef NDEBUG
            GGML_LOG_DEBUG("%s: cannot reallocate multi buffer graph automatically, call reserve\n", __func__);
#endif
            return false;
        }
    }

    // reset buffers
    for (int i = 0; i < galloc->n_buffers; i++) {
        if (galloc->buffers[i] != NULL) {
            ggml_backend_buffer_reset(galloc->buffers[i]);
        }
    }

    // allocate the graph tensors from the previous assignments
    // leafs
    for (int i = 0; i < graph->n_leafs; i++) {
        struct ggml_tensor * leaf = graph->leafs[i];
        struct leaf_alloc * leaf_alloc = &galloc->leaf_allocs[i];
        ggml_gallocr_init_tensor(galloc, leaf, &leaf_alloc->leaf);
    }
    // nodes
    for (int i = 0; i < graph->n_nodes; i++) {
        struct ggml_tensor * node = graph->nodes[i];
        struct node_alloc * node_alloc = &galloc->node_allocs[i];
        for (int j = 0; j < GGML_MAX_SRC; j++) {
            struct ggml_tensor * src = node->src[j];
            if (src == NULL) {
                continue;
            }
            ggml_gallocr_init_tensor(galloc, src, &node_alloc->src[j]);
        }
        ggml_gallocr_init_tensor(galloc, node, &node_alloc->dst);
    }

    return true;
}